

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void retstat(LexState *ls)

{
  int iVar1;
  int local_38;
  uint local_34;
  int nret;
  int first;
  expdesc e;
  FuncState *fs;
  LexState *ls_local;
  
  e._16_8_ = ls->fs;
  luaX_next(ls);
  iVar1 = block_follow((ls->t).token);
  if ((iVar1 == 0) && ((ls->t).token != 0x3b)) {
    local_38 = explist1(ls,(expdesc *)&nret);
    if ((nret == 0xd) || (nret == 0xe)) {
      luaK_setreturns((FuncState *)e._16_8_,(expdesc *)&nret,-1);
      if ((nret == 0xd) && (local_38 == 1)) {
        *(uint *)(*(long *)(*(long *)e._16_8_ + 0x18) + (long)(int)e.k * 4) =
             *(uint *)(*(long *)(*(long *)e._16_8_ + 0x18) + (long)(int)e.k * 4) & 0xffffffc0 | 0x1d
        ;
      }
      local_34 = (uint)*(byte *)(e._16_8_ + 0x4a);
      local_38 = -1;
    }
    else if (local_38 == 1) {
      local_34 = luaK_exp2anyreg((FuncState *)e._16_8_,(expdesc *)&nret);
    }
    else {
      luaK_exp2nextreg((FuncState *)e._16_8_,(expdesc *)&nret);
      local_34 = (uint)*(byte *)(e._16_8_ + 0x4a);
    }
  }
  else {
    local_38 = 0;
    local_34 = 0;
  }
  luaK_ret((FuncState *)e._16_8_,local_34,local_38);
  return;
}

Assistant:

static void retstat(LexState*ls){
FuncState*fs=ls->fs;
expdesc e;
int first,nret;
luaX_next(ls);
if(block_follow(ls->t.token)||ls->t.token==';')
first=nret=0;
else{
nret=explist1(ls,&e);
if(hasmultret(e.k)){
luaK_setmultret(fs,&e);
if(e.k==VCALL&&nret==1){
SET_OPCODE(getcode(fs,&e),OP_TAILCALL);
}
first=fs->nactvar;
nret=(-1);
}
else{
if(nret==1)
first=luaK_exp2anyreg(fs,&e);
else{
luaK_exp2nextreg(fs,&e);
first=fs->nactvar;
}
}
}
luaK_ret(fs,first,nret);
}